

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

TimingControl *
slang::ast::BlockEventListControl::fromSyntax
          (BlockEventExpressionSyntax *syntax,ASTContext *context)

{
  Compilation *comp;
  long lVar1;
  byte bVar2;
  int iVar3;
  Expression *pEVar4;
  Symbol *pSVar5;
  BlockEventListControl *pBVar6;
  Symbol *pSVar7;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  SourceRange SVar8;
  SmallVector<slang::ast::BlockEventListControl::Event,_4UL> events;
  undefined1 local_b0 [8];
  __extent_storage<18446744073709551615UL> local_a8;
  SyntaxNode *local_a0;
  SmallVectorBase<slang::ast::BlockEventListControl::Event> local_98 [2];
  SourceRange local_40;
  
  comp = ((context->scope).ptr)->compilation;
  local_98[0].data_ = (pointer)local_98[0].firstElement;
  local_98[0].len = 0;
  local_98[0].cap = 4;
  local_a0 = &syntax->super_SyntaxNode;
  do {
    if ((syntax->super_SyntaxNode).kind != BinaryBlockEventExpression) {
      pEVar4 = ArbitrarySymbolExpression::fromSyntax
                         (comp,(NameSyntax *)syntax[1].super_SyntaxNode.previewNode,context,
                          (bitmask<slang::ast::LookupFlags>)0x0);
      pSVar7 = Expression::getSymbolReference(pEVar4,true);
      if (pSVar7 == (Symbol *)0x0) {
        bVar2 = 0;
        src = extraout_RDX;
      }
      else if ((pSVar7->kind == StatementBlock) || (pSVar7->kind == Subroutine)) {
        local_a8._M_extent_value._0_1_ =
             (short)syntax[1].super_SyntaxNode.kind == CopyClassExpression;
        local_b0 = (undefined1  [8])pEVar4;
        SmallVectorBase<slang::ast::BlockEventListControl::Event>::
        emplace_back<slang::ast::BlockEventListControl::Event>(local_98,(Event *)local_b0);
        bVar2 = 1;
        src = extraout_RDX_00;
      }
      else {
        SVar8 = slang::syntax::SyntaxNode::sourceRange(syntax[1].super_SyntaxNode.previewNode);
        ASTContext::addDiag(context,(DiagCode)0x1f0008,SVar8);
        bVar2 = 0;
        src = extraout_RDX_01;
      }
      if ((bool)(pSVar7 != (Symbol *)0x0 & bVar2)) {
        iVar3 = SmallVectorBase<slang::ast::BlockEventListControl::Event>::copy
                          (local_98,(EVP_PKEY_CTX *)comp,src);
        local_b0 = (undefined1  [8])CONCAT44(extraout_var,iVar3);
        local_a8._M_extent_value = extraout_RDX_02;
        local_40 = slang::syntax::SyntaxNode::sourceRange(local_a0);
        pBVar6 = BumpAllocator::
                 emplace<slang::ast::BlockEventListControl,std::span<slang::ast::BlockEventListControl::Event,18446744073709551615ul>,slang::SourceRange>
                           (&comp->super_BumpAllocator,
                            (span<slang::ast::BlockEventListControl::Event,_18446744073709551615UL>
                             *)local_b0,&local_40);
      }
      else {
        local_b0 = (undefined1  [8])0x0;
        pBVar6 = (BlockEventListControl *)
                 BumpAllocator::
                 emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                           (&comp->super_BumpAllocator,(TimingControl **)local_b0);
      }
LAB_0034fecb:
      if (local_98[0].data_ != (pointer)local_98[0].firstElement) {
        operator_delete(local_98[0].data_);
      }
      return &pBVar6->super_TimingControl;
    }
    lVar1 = *(long *)&syntax[1].super_SyntaxNode;
    pEVar4 = ArbitrarySymbolExpression::fromSyntax
                       (comp,*(NameSyntax **)(lVar1 + 0x28),context,
                        (bitmask<slang::ast::LookupFlags>)0x0);
    pSVar5 = Expression::getSymbolReference(pEVar4,true);
    pSVar7 = pSVar5;
    if (pSVar5 != (Symbol *)0x0) {
      if ((pSVar5->kind == StatementBlock) || (pSVar5->kind == Subroutine)) {
        local_a8._M_extent_value._0_1_ = *(short *)(lVar1 + 0x18) == 0x69;
        local_b0 = (undefined1  [8])pEVar4;
        SmallVectorBase<slang::ast::BlockEventListControl::Event>::
        emplace_back<slang::ast::BlockEventListControl::Event>(local_98,(Event *)local_b0);
        pSVar7 = (Symbol *)0x1;
      }
      else {
        SVar8 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(lVar1 + 0x28));
        ASTContext::addDiag(context,(DiagCode)0x1f0008,SVar8);
        pSVar7 = (Symbol *)0x0;
      }
    }
    if ((pSVar5 != (Symbol *)0x0 & (byte)pSVar7) == 0) {
      local_b0 = (undefined1  [8])0x0;
      pBVar6 = (BlockEventListControl *)
               BumpAllocator::
               emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                         (&comp->super_BumpAllocator,(TimingControl **)local_b0);
      goto LAB_0034fecb;
    }
    syntax = *(BlockEventExpressionSyntax **)&syntax[2].super_SyntaxNode;
  } while( true );
}

Assistant:

TimingControl& BlockEventListControl::fromSyntax(const BlockEventExpressionSyntax& syntax,
                                                 const ASTContext& context) {
    auto& comp = context.getCompilation();
    SmallVector<Event, 4> events;

    auto addEvent = [&](const PrimaryBlockEventExpressionSyntax& evSyntax) {
        auto& expr = ArbitrarySymbolExpression::fromSyntax(comp, *evSyntax.name, context);
        if (auto symbol = expr.getSymbolReference()) {
            if (symbol->kind != SymbolKind::StatementBlock &&
                symbol->kind != SymbolKind::Subroutine) {
                context.addDiag(diag::InvalidBlockEventTarget, evSyntax.name->sourceRange());
                return false;
            }

            events.push_back({&expr, evSyntax.keyword.kind == TokenKind::BeginKeyword});
            return true;
        }

        return false;
    };

    const BlockEventExpressionSyntax* curr = &syntax;
    while (curr->kind == SyntaxKind::BinaryBlockEventExpression) {
        auto& bin = curr->as<BinaryBlockEventExpressionSyntax>();
        if (!addEvent(bin.left->as<PrimaryBlockEventExpressionSyntax>()))
            return badCtrl(comp, nullptr);

        curr = bin.right;
    }

    if (!addEvent(curr->as<PrimaryBlockEventExpressionSyntax>()))
        return badCtrl(comp, nullptr);

    return *comp.emplace<BlockEventListControl>(events.copy(comp), syntax.sourceRange());
}